

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError BuildDeviceList(PaAlsaHostApiRepresentation *alsaApi)

{
  PaUtilAllocationGroup *pPVar1;
  char *pcVar2;
  PaAlsaHostApiRepresentation *pPVar3;
  byte *pbVar4;
  snd_ctl_t *psVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  char *pcVar10;
  size_t sVar11;
  char *pcVar12;
  byte *pbVar13;
  byte *pbVar14;
  PaAlsaDeviceInfo *pPVar15;
  long lVar16;
  undefined8 uVar17;
  char *pcVar18;
  PaDeviceInfo **ppPVar19;
  pthread_t pVar20;
  undefined4 uVar21;
  int __pa_unsure_error_id;
  snd_config_t *psVar22;
  byte bVar23;
  byte *pbVar24;
  PaError PVar25;
  HwDevInfo *pHVar26;
  snd_config_t *psVar27;
  long lVar28;
  bool bVar29;
  undefined8 uStack_130;
  snd_config_t local_128 [8];
  char alsaCardName [50];
  char *local_e8;
  char buf [50];
  char *local_a8;
  char *alsaDeviceName;
  undefined8 local_98;
  snd_config_t *topNode;
  PaAlsaDeviceInfo *local_88;
  undefined8 uStack_80;
  char *local_78;
  int local_70;
  uint local_6c;
  char *local_68;
  int local_60;
  uint local_5c;
  int devIdx_1;
  byte *local_50;
  char *cardName;
  snd_ctl_t *ctl;
  int local_34 [2];
  int devIdx;
  
  local_34[0] = 0;
  local_98 = 0;
  uStack_130 = 0x10cd55;
  pcVar10 = getenv("PA_ALSA_INITIALIZE_BLOCK");
  if (pcVar10 == (char *)0x0) {
    local_5c = 1;
  }
  else {
    uStack_130 = 0x10cd62;
    iVar6 = atoi(pcVar10);
    local_5c = (uint)(iVar6 == 0);
  }
  uStack_130 = 0x10cd80;
  pcVar10 = getenv("PA_ALSA_PLUGHW");
  if (pcVar10 == (char *)0x0) {
    local_6c = 0;
    local_68 = "";
  }
  else {
    uStack_130 = 0x10cd8d;
    iVar6 = atoi(pcVar10);
    local_6c = (uint)(iVar6 != 0);
    local_68 = "";
    if (iVar6 != 0) {
      local_68 = "plug";
    }
  }
  (alsaApi->baseHostApiRep).info.defaultInputDevice = -1;
  (alsaApi->baseHostApiRep).info.defaultOutputDevice = -1;
  local_70 = -1;
  uStack_130 = 0x10cdd2;
  sVar11 = snd_ctl_card_info_sizeof();
  lVar28 = -(sVar11 + 0xf & 0xfffffffffffffff0);
  psVar27 = local_128 + lVar28;
  alsaDeviceName = (char *)psVar27;
  *(undefined8 *)(local_128 + lVar28 + -8) = 0x10cdf4;
  memset(psVar27,0,sVar11);
  *(undefined8 *)(local_128 + lVar28 + -8) = 0x10cdf9;
  sVar11 = snd_pcm_info_sizeof();
  psVar27 = psVar27 + -(sVar11 + 0xf & 0xfffffffffffffff0);
  *(undefined8 *)(psVar27 + -8) = 0x10ce17;
  memset(psVar27,0,sVar11);
  *(undefined8 *)(psVar27 + -8) = 1;
  local_78 = *(char **)(psVar27 + -8);
  ctl = (snd_ctl_t *)0x0;
  pcVar10 = (char *)0x0;
  psVar22 = psVar27;
  topNode = psVar27;
  _devIdx_1 = alsaApi;
  while( true ) {
    *(undefined8 *)(psVar27 + -8) = 0x10ce44;
    iVar6 = snd_card_next(&local_70);
    if ((iVar6 != 0) || (local_70 < 0)) break;
    local_60 = -1;
    *(undefined8 *)(psVar27 + -8) = 0x32;
    sVar11 = *(size_t *)(psVar27 + -8);
    *(undefined8 *)(psVar27 + -8) = 0x10ce76;
    snprintf((char *)local_128,sVar11,"hw:%d");
    *(undefined8 *)(psVar27 + -8) = 0x10ce84;
    iVar6 = snd_ctl_open(&cardName,local_128,0);
    pcVar18 = cardName;
    pcVar12 = alsaDeviceName;
    if (-1 < iVar6) {
      *(undefined8 *)(psVar27 + -8) = 0x10ce9b;
      snd_ctl_card_info(pcVar18,pcVar12);
      *(undefined8 *)(psVar27 + -8) = 0x10cea3;
      pcVar12 = (char *)snd_ctl_card_info_get_name(pcVar12);
      *(undefined8 *)(psVar27 + -8) = 0x10ceb2;
      paUtilErr_ = PaAlsa_StrDup(alsaApi,(char **)&local_50,pcVar12);
      if (paUtilErr_ < 0) {
        pcVar10 = 
        "Expression \'PaAlsa_StrDup( alsaApi, &cardName, alsa_snd_ctl_card_info_get_name( cardInfo ))\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1291\n"
        ;
LAB_0010d499:
        *(undefined8 *)(psVar27 + -8) = 0x10d4a0;
        PaUtil_DebugPrint(pcVar10);
        return paUtilErr_;
      }
      while( true ) {
        pcVar12 = cardName;
        *(undefined8 *)(psVar27 + -8) = 0x10cecd;
        iVar6 = snd_ctl_pcm_next_device(pcVar12,&local_60);
        pcVar12 = cardName;
        if ((iVar6 != 0) || (local_60 < 0)) break;
        *(undefined8 *)(psVar27 + -8) = 0x32;
        pcVar12 = local_68;
        sVar11 = *(size_t *)(psVar27 + -8);
        *(undefined8 *)(psVar27 + -8) = 0x10cf01;
        snprintf((char *)&local_e8,sVar11,"%s%s,%d",pcVar12,local_128);
        iVar6 = local_60;
        *(undefined8 *)(psVar27 + -8) = 0x10cf0c;
        snd_pcm_info_set_device(psVar22,iVar6);
        *(undefined8 *)(psVar27 + -8) = 0x10cf16;
        snd_pcm_info_set_subdevice(psVar22,0);
        *(undefined8 *)(psVar27 + -8) = 1;
        uVar17 = *(undefined8 *)(psVar27 + -8);
        *(undefined8 *)(psVar27 + -8) = 0x10cf21;
        snd_pcm_info_set_stream(psVar22,uVar17);
        pcVar12 = cardName;
        *(undefined8 *)(psVar27 + -8) = 0x10cf2d;
        uVar7 = snd_ctl_pcm_info(pcVar12,psVar22);
        *(undefined8 *)(psVar27 + -8) = 0x10cf39;
        snd_pcm_info_set_stream(psVar22,0);
        pcVar12 = cardName;
        *(undefined8 *)(psVar27 + -8) = 0x10cf45;
        uVar8 = snd_ctl_pcm_info(pcVar12,psVar22);
        if (-1 < (int)(uVar8 & uVar7)) {
          local_88 = (PaAlsaDeviceInfo *)CONCAT44(uVar7,uVar8);
          uStack_80 = 0;
          *(undefined8 *)(psVar27 + -8) = 0x10cf66;
          pbVar13 = (byte *)snd_pcm_info_get_name();
          pbVar4 = local_50;
          pbVar24 = local_50;
LAB_0010cf74:
          bVar23 = *pbVar13;
          pbVar14 = pbVar13;
          if (*pbVar24 != 0) {
            while ((bVar23 != 0 && (bVar23 == *pbVar24))) {
              pbVar24 = pbVar24 + 1;
              bVar23 = pbVar14[1];
              pbVar14 = pbVar14 + 1;
              if ((bVar23 & 0xdf) == 0) {
                pbVar13 = pbVar14;
              }
            }
            do {
              bVar23 = *pbVar24;
              if (bVar23 == 0) break;
              pbVar24 = pbVar24 + 1;
            } while (bVar23 != 0x20);
            goto LAB_0010cf74;
          }
          pbVar24 = (byte *)"-";
          if (bVar23 != 0) {
            while (bVar23 == 0x20) {
              pbVar24 = pbVar13 + 1;
              pbVar13 = pbVar13 + 1;
              bVar23 = *pbVar24;
            }
            if ((bVar23 == 0x2d) || (pbVar24 = pbVar13, bVar23 == 0x3a)) {
              pbVar24 = pbVar13 + (ulong)(pbVar13[1] == 0x20) * 2;
            }
          }
          *(undefined8 *)(psVar27 + -8) = 0x10cfff;
          iVar6 = snprintf((char *)0x0,0,"%s: %s (%s)",pbVar4,pbVar24,&local_e8);
          pPVar1 = _devIdx_1->allocations;
          *(undefined8 *)(psVar27 + -8) = 0x10d01a;
          pcVar12 = (char *)PaUtil_GroupAllocateMemory(pPVar1,(long)(iVar6 + 1));
          pbVar4 = local_50;
          if (pcVar12 == (char *)0x0) {
            pcVar10 = 
            "Expression \'deviceName = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1327\n"
            ;
            goto LAB_0010d4fc;
          }
          *(undefined8 *)(psVar27 + -8) = 0x10d044;
          snprintf(pcVar12,(long)(iVar6 + 1),"%s: %s (%s)",pbVar4,pbVar24,&local_e8);
          psVar5 = ctl;
          pcVar18 = local_78;
          if (local_78 < pcVar10 + 1 || ctl == (snd_ctl_t *)0x0) {
            sVar11 = (long)local_78 << 6;
            *(undefined8 *)(psVar27 + -8) = 0x10d072;
            ctl = (snd_ctl_t *)realloc(psVar5,sVar11);
            if (ctl == (snd_ctl_t *)0x0) {
              pcVar10 = 
              "Expression \'hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1335\n"
              ;
              goto LAB_0010d4fc;
            }
            local_78 = (char *)((long)pcVar18 * 2);
          }
          alsaApi = _devIdx_1;
          *(undefined8 *)(psVar27 + -8) = 0x10d0a9;
          paUtilErr_ = PaAlsa_StrDup(alsaApi,&local_a8,(char *)&local_e8);
          if (paUtilErr_ < 0) {
            pcVar10 = 
            "Expression \'PaAlsa_StrDup( alsaApi, &alsaDeviceName, buf )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1338\n"
            ;
            goto LAB_0010d499;
          }
          lVar28 = (long)pcVar10 * 0x20;
          *(char **)(ctl + lVar28) = local_a8;
          *(char **)(ctl + lVar28 + 8) = pcVar12;
          *(uint *)(ctl + lVar28 + 0x10) = local_6c;
          *(ulong *)(ctl + lVar28 + 0x14) =
               CONCAT44(-(uint)(-1 < (long)local_88) >> 0x1f,-(uint)(-1 < (int)local_88) >> 0x1f);
          psVar22 = topNode;
          pcVar10 = pcVar10 + 1;
        }
      }
      *(undefined8 *)(psVar27 + -8) = 0x10d10f;
      snd_ctl_close(pcVar12);
    }
  }
  if (_snd_config == 0) {
    *(undefined8 *)(psVar27 + -8) = 0x10d128;
    iVar6 = snd_config_update();
    if (iVar6 < 0) {
      *(undefined8 *)(psVar27 + -8) = 0x10d5b7;
      pVar20 = pthread_self();
      *(undefined8 *)(psVar27 + -8) = 0x10d5c9;
      iVar9 = pthread_equal(pVar20,paUnixMainThread);
      if (iVar9 != 0) {
        *(undefined8 *)(psVar27 + -8) = 0x10d5d7;
        pcVar10 = (char *)snd_strerror(iVar6);
        *(undefined8 *)(psVar27 + -8) = 8;
        uVar17 = *(undefined8 *)(psVar27 + -8);
        *(undefined8 *)(psVar27 + -8) = 0x10d5e5;
        PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar17,(long)iVar6,pcVar10);
      }
      *(undefined8 *)(psVar27 + -8) = 0x10d5f3;
      PaUtil_DebugPrint(
                       "Expression \'alsa_snd_config_update()\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1353\n"
                       );
      return -9999;
    }
    if (_snd_config == 0) {
      *(code **)(psVar27 + -8) = CloseStream;
      __assert_fail("*alsa_snd_config",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                    ,0x54c,"PaError BuildDeviceList(PaAlsaHostApiRepresentation *)");
    }
  }
  *(undefined8 *)(psVar27 + -8) = 0x10d14f;
  iVar6 = snd_config_search(_snd_config,"pcm",&local_98);
  uVar17 = local_98;
  if (-1 < iVar6) {
    *(undefined8 *)(psVar27 + -8) = 0x10d163;
    pPVar15 = (PaAlsaDeviceInfo *)snd_config_iterator_first(uVar17);
    topNode = (snd_config_t *)paHostApiInitializers;
LAB_0010d17f:
    while( true ) {
      *(undefined8 *)(psVar27 + -8) = 0x10d187;
      lVar28 = snd_config_iterator_next(pPVar15);
      uVar17 = local_98;
      *(undefined8 *)(psVar27 + -8) = 0x10d196;
      lVar16 = snd_config_iterator_end(uVar17);
      alsaApi = _devIdx_1;
      if (pPVar15 == (PaAlsaDeviceInfo *)lVar16) break;
      local_e8 = "unknown";
      local_50 = (byte *)0x0;
      *(undefined8 *)(psVar27 + -8) = 0x10d1ba;
      uVar17 = snd_config_iterator_entry(pPVar15);
      cardName = (char *)0x0;
      *(undefined8 *)(psVar27 + -8) = 0x10d1d5;
      iVar6 = snd_config_search(uVar17,"type",&cardName);
      pcVar12 = cardName;
      if (iVar6 < 0) {
        if (iVar6 != -2) {
          *(undefined8 *)(psVar27 + -8) = 0x10d4ae;
          pVar20 = pthread_self();
          *(undefined8 *)(psVar27 + -8) = 0x10d4c0;
          iVar9 = pthread_equal(pVar20,paUnixMainThread);
          pcVar10 = 
          "Expression \'err\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1374\n"
          ;
          goto LAB_0010d4c7;
        }
      }
      else {
        *(undefined8 *)(psVar27 + -8) = 0x10d1e9;
        iVar6 = snd_config_get_string(pcVar12,&local_e8);
        if (iVar6 < 0) {
          *(undefined8 *)(psVar27 + -8) = 0x10d553;
          pVar20 = pthread_self();
          *(undefined8 *)(psVar27 + -8) = 0x10d565;
          iVar9 = pthread_equal(pVar20,paUnixMainThread);
          pcVar10 = 
          "Expression \'alsa_snd_config_get_string( tp, &tpStr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1379\n"
          ;
          goto LAB_0010d4c7;
        }
      }
      *(undefined8 *)(psVar27 + -8) = 0x10d209;
      iVar6 = snd_config_get_id(uVar17,&local_50);
      pbVar4 = local_50;
      if (iVar6 < 0) {
        *(undefined8 *)(psVar27 + -8) = 0x10d52e;
        pVar20 = pthread_self();
        *(undefined8 *)(psVar27 + -8) = 0x10d540;
        iVar9 = pthread_equal(pVar20,paUnixMainThread);
        pcVar10 = 
        "Expression \'alsa_snd_config_get_id( n, &idStr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1381\n"
        ;
LAB_0010d4c7:
        if (iVar9 != 0) {
          *(undefined8 *)(psVar27 + -8) = 0x10d4d5;
          pcVar12 = (char *)snd_strerror(iVar6);
          *(undefined8 *)(psVar27 + -8) = 8;
          uVar17 = *(undefined8 *)(psVar27 + -8);
          *(undefined8 *)(psVar27 + -8) = 0x10d4e3;
          PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar17,(long)iVar6,pcVar12);
        }
        PVar25 = -9999;
LAB_0010d4e9:
        *(undefined8 *)(psVar27 + -8) = 0x10d4f3;
        PaUtil_DebugPrint(pcVar10);
        return PVar25;
      }
      lVar16 = 0;
      do {
        pPVar3 = _devIdx_1;
        if (lVar16 == 0x50) {
          pPVar1 = _devIdx_1->allocations;
          local_88 = (PaAlsaDeviceInfo *)lVar28;
          *(undefined8 *)(psVar27 + -8) = 0x10d250;
          sVar11 = strlen((char *)pbVar4);
          *(undefined8 *)(psVar27 + -8) = 0x10d25c;
          pcVar12 = (char *)PaUtil_GroupAllocateMemory(pPVar1,sVar11 + 6);
          pbVar4 = local_50;
          PVar25 = -0x2708;
          if (pcVar12 == (char *)0x0) {
            pcVar10 = 
            "Expression \'alsaDeviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations, strlen(idStr) + 6 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1390\n"
            ;
            goto LAB_0010d4e9;
          }
          *(undefined8 *)(psVar27 + -8) = 0x10d27a;
          strcpy(pcVar12,(char *)pbVar4);
          pbVar4 = local_50;
          pPVar1 = pPVar3->allocations;
          *(undefined8 *)(psVar27 + -8) = 0x10d28a;
          sVar11 = strlen((char *)pbVar4);
          *(undefined8 *)(psVar27 + -8) = 0x10d296;
          pcVar18 = (char *)PaUtil_GroupAllocateMemory(pPVar1,sVar11 + 1);
          pbVar4 = local_50;
          if (pcVar18 == (char *)0x0) {
            pcVar10 = 
            "Expression \'deviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations, strlen(idStr) + 1 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1393\n"
            ;
          }
          else {
            *(undefined8 *)(psVar27 + -8) = 0x10d2ae;
            strcpy(pcVar18,(char *)pbVar4);
            psVar5 = ctl;
            pcVar2 = local_78;
            local_68 = pcVar10 + 1;
            if ((ctl != (snd_ctl_t *)0x0) && (psVar22 = topNode, pcVar10 + 1 <= local_78))
            goto LAB_0010d2f1;
            sVar11 = (long)local_78 << 6;
            *(undefined8 *)(psVar27 + -8) = 0x10d2d6;
            ctl = (snd_ctl_t *)realloc(psVar5,sVar11);
            if (ctl != (snd_ctl_t *)0x0) {
              local_78 = (char *)((long)pcVar2 * 2);
              psVar22 = topNode;
              goto LAB_0010d2f1;
            }
            pcVar10 = 
            "Expression \'hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1401\n"
            ;
          }
          PVar25 = -0x2708;
          goto LAB_0010d4e9;
        }
        pcVar12 = *(char **)((long)&IgnorePlugin_ignoredPlugins + lVar16);
        *(undefined8 *)(psVar27 + -8) = 0x10d22c;
        iVar6 = strcmp((char *)pbVar4,pcVar12);
        lVar16 = lVar16 + 8;
        pPVar15 = (PaAlsaDeviceInfo *)lVar28;
      } while (iVar6 != 0);
    }
  }
  pPVar1 = alsaApi->allocations;
  *(undefined8 *)(psVar27 + -8) = 0x10d36e;
  ppPVar19 = (PaDeviceInfo **)PaUtil_GroupAllocateMemory(pPVar1,(long)pcVar10 * 8);
  (alsaApi->baseHostApiRep).deviceInfos = ppPVar19;
  if (ppPVar19 == (PaDeviceInfo **)0x0) {
    pcVar10 = 
    "Expression \'baseApi->deviceInfos = (PaDeviceInfo**)PaUtil_GroupAllocateMemory( alsaApi->allocations, sizeof(PaDeviceInfo*) * (numDeviceNames) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1427\n"
    ;
  }
  else {
    pPVar1 = alsaApi->allocations;
    *(undefined8 *)(psVar27 + -8) = 0x10d38b;
    pPVar15 = (PaAlsaDeviceInfo *)PaUtil_GroupAllocateMemory(pPVar1,(long)pcVar10 * 0x60);
    if (pPVar15 != (PaAlsaDeviceInfo *)0x0) {
      local_34[0] = 0;
      pcVar12 = pcVar10;
      pHVar26 = (HwDevInfo *)ctl;
      local_88 = pPVar15;
      while (pPVar3 = _devIdx_1, bVar29 = pcVar12 != (char *)0x0, pcVar12 = pcVar12 + -1, bVar29) {
        pcVar18 = pHVar26->name;
        *(undefined8 *)(psVar27 + -8) = 0x10d3c2;
        iVar6 = strcmp(pcVar18,"dmix");
        if (iVar6 != 0) {
          *(undefined8 *)(psVar27 + -8) = 0x10d3d5;
          iVar6 = strcmp(pcVar18,"default");
          pPVar3 = _devIdx_1;
          uVar7 = local_5c;
          if (iVar6 != 0) {
            *(undefined8 *)(psVar27 + -8) = 0x10d3ef;
            FillInDevInfo(pPVar3,pHVar26,uVar7,pPVar15,local_34);
            paUtilErr_ = 0;
          }
        }
        pPVar15 = pPVar15 + 1;
        pHVar26 = pHVar26 + 1;
      }
      pHVar26 = (HwDevInfo *)ctl;
      if (pcVar10 <= (char *)(long)local_34[0]) {
        *(undefined8 *)(psVar27 + -8) = 0x10d61d;
        __assert_fail("devIdx < numDeviceNames",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0x5ad,"PaError BuildDeviceList(PaAlsaHostApiRepresentation *)");
      }
      do {
        psVar5 = ctl;
        bVar29 = pcVar10 == (char *)0x0;
        pcVar10 = pcVar10 + -1;
        if (bVar29) {
          *(undefined8 *)(psVar27 + -8) = 0x10d47a;
          free(psVar5);
          (pPVar3->baseHostApiRep).info.deviceCount = local_34[0];
          return 0;
        }
        pcVar12 = pHVar26->name;
        *(undefined8 *)(psVar27 + -8) = 0x10d432;
        iVar6 = strcmp(pcVar12,"dmix");
        if (iVar6 == 0) {
LAB_0010d449:
          uVar7 = local_5c;
          pPVar15 = local_88;
          *(undefined8 *)(psVar27 + -8) = 0x10d45f;
          FillInDevInfo(pPVar3,pHVar26,uVar7,pPVar15,local_34);
          paUtilErr_ = 0;
        }
        else {
          *(undefined8 *)(psVar27 + -8) = 0x10d445;
          iVar6 = strcmp(pcVar12,"default");
          if (iVar6 == 0) goto LAB_0010d449;
        }
        local_88 = local_88 + 1;
        pHVar26 = pHVar26 + 1;
      } while( true );
    }
    pcVar10 = 
    "Expression \'deviceInfoArray = (PaAlsaDeviceInfo*)PaUtil_GroupAllocateMemory( alsaApi->allocations, sizeof(PaAlsaDeviceInfo) * numDeviceNames )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1431\n"
    ;
  }
LAB_0010d4fc:
  *(undefined8 *)(psVar27 + -8) = 0x10d503;
  PaUtil_DebugPrint(pcVar10);
  return -0x2708;
  while( true ) {
    *(undefined8 *)(psVar27 + -8) = 0x10d302;
    iVar6 = strcmp(pcVar12,pcVar2);
    psVar22 = psVar22 + 0x20;
    if (iVar6 == 0) break;
LAB_0010d2f1:
    pcVar2 = *(char **)(psVar22 + 0x20);
    if (pcVar2 == (char *)0x0) {
      psVar22 = (snd_config_t *)0x0;
      break;
    }
  }
  psVar5 = ctl;
  lVar28 = (long)pcVar10 * 0x20;
  *(char **)(ctl + lVar28) = pcVar12;
  *(char **)(ctl + lVar28 + 8) = pcVar18;
  *(undefined4 *)(ctl + lVar28 + 0x10) = 1;
  if (psVar22 == (snd_config_t *)0x0) {
    *(undefined4 *)(ctl + lVar28 + 0x14) = 1;
    *(undefined8 *)(psVar27 + -8) = 1;
    uVar21 = (undefined4)*(undefined8 *)(psVar27 + -8);
  }
  else {
    *(undefined4 *)(ctl + lVar28 + 0x14) = *(undefined4 *)(psVar22 + 0x14);
    uVar21 = *(undefined4 *)(psVar22 + 0x18);
  }
  *(undefined4 *)(psVar5 + lVar28 + 0x18) = uVar21;
  pPVar15 = local_88;
  pcVar10 = local_68;
  goto LAB_0010d17f;
}

Assistant:

static PaError BuildDeviceList( PaAlsaHostApiRepresentation *alsaApi )
{
    PaUtilHostApiRepresentation *baseApi = &alsaApi->baseHostApiRep;
    PaAlsaDeviceInfo *deviceInfoArray;
    int cardIdx = -1, devIdx = 0;
    snd_ctl_card_info_t *cardInfo;
    PaError result = paNoError;
    size_t numDeviceNames = 0, maxDeviceNames = 1, i;
    HwDevInfo *hwDevInfos = NULL;
    snd_config_t *topNode = NULL;
    snd_pcm_info_t *pcmInfo;
    int res;
    int blocking = SND_PCM_NONBLOCK;
    int usePlughw = 0;
    char *hwPrefix = "";
    char alsaCardName[50];
#ifdef PA_ENABLE_DEBUG_OUTPUT
    PaTime startTime = PaUtil_GetTime();
#endif

    if( getenv( "PA_ALSA_INITIALIZE_BLOCK" ) && atoi( getenv( "PA_ALSA_INITIALIZE_BLOCK" ) ) )
        blocking = 0;

    /* If PA_ALSA_PLUGHW is 1 (non-zero), use the plughw: pcm throughout instead of hw: */
    if( getenv( "PA_ALSA_PLUGHW" ) && atoi( getenv( "PA_ALSA_PLUGHW" ) ) )
    {
        usePlughw = 1;
        hwPrefix = "plug";
        PA_DEBUG(( "%s: Using Plughw\n", __FUNCTION__ ));
    }

    /* These two will be set to the first working input and output device, respectively */
    baseApi->info.defaultInputDevice = paNoDevice;
    baseApi->info.defaultOutputDevice = paNoDevice;

    /* Gather info about hw devices

     * alsa_snd_card_next() modifies the integer passed to it to be:
     *      the index of the first card if the parameter is -1
     *      the index of the next card if the parameter is the index of a card
     *      -1 if there are no more cards
     *
     * The function itself returns 0 if it succeeded. */
    cardIdx = -1;
    alsa_snd_ctl_card_info_alloca( &cardInfo );
    alsa_snd_pcm_info_alloca( &pcmInfo );
    while( alsa_snd_card_next( &cardIdx ) == 0 && cardIdx >= 0 )
    {
        char *cardName;
        int devIdx = -1;
        snd_ctl_t *ctl;
        char buf[50];

        snprintf( alsaCardName, sizeof (alsaCardName), "hw:%d", cardIdx );

        /* Acquire name of card */
        if( alsa_snd_ctl_open( &ctl, alsaCardName, 0 ) < 0 )
        {
            /* Unable to open card :( */
            PA_DEBUG(( "%s: Unable to open device %s\n", __FUNCTION__, alsaCardName ));
            continue;
        }
        alsa_snd_ctl_card_info( ctl, cardInfo );

        PA_ENSURE( PaAlsa_StrDup( alsaApi, &cardName, alsa_snd_ctl_card_info_get_name( cardInfo )) );

        while( alsa_snd_ctl_pcm_next_device( ctl, &devIdx ) == 0 && devIdx >= 0 )
        {
            char *alsaDeviceName, *deviceName, *infoName;
            size_t len;
            int hasPlayback = 0, hasCapture = 0;

            snprintf( buf, sizeof (buf), "%s%s,%d", hwPrefix, alsaCardName, devIdx );

            /* Obtain info about this particular device */
            alsa_snd_pcm_info_set_device( pcmInfo, devIdx );
            alsa_snd_pcm_info_set_subdevice( pcmInfo, 0 );
            alsa_snd_pcm_info_set_stream( pcmInfo, SND_PCM_STREAM_CAPTURE );
            if( alsa_snd_ctl_pcm_info( ctl, pcmInfo ) >= 0 )
            {
                hasCapture = 1;
            }

            alsa_snd_pcm_info_set_stream( pcmInfo, SND_PCM_STREAM_PLAYBACK );
            if( alsa_snd_ctl_pcm_info( ctl, pcmInfo ) >= 0 )
            {
                hasPlayback = 1;
            }

            if( !hasPlayback && !hasCapture )
            {
                /* Error */
                continue;
            }

            infoName = SkipCardDetailsInName( (char *)alsa_snd_pcm_info_get_name( pcmInfo ), cardName );

            /* The length of the string written by snprintf plus terminating 0 */
            len = snprintf( NULL, 0, "%s: %s (%s)", cardName, infoName, buf ) + 1;
            PA_UNLESS( deviceName = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len ),
                    paInsufficientMemory );
            snprintf( deviceName, len, "%s: %s (%s)", cardName, infoName, buf );

            ++numDeviceNames;
            if( !hwDevInfos || numDeviceNames > maxDeviceNames )
            {
                maxDeviceNames *= 2;
                PA_UNLESS( hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) ),
                        paInsufficientMemory );
            }

            PA_ENSURE( PaAlsa_StrDup( alsaApi, &alsaDeviceName, buf ) );

            hwDevInfos[ numDeviceNames - 1 ].alsaName = alsaDeviceName;
            hwDevInfos[ numDeviceNames - 1 ].name = deviceName;
            hwDevInfos[ numDeviceNames - 1 ].isPlug = usePlughw;
            hwDevInfos[ numDeviceNames - 1 ].hasPlayback = hasPlayback;
            hwDevInfos[ numDeviceNames - 1 ].hasCapture = hasCapture;
        }
        alsa_snd_ctl_close( ctl );
    }

    /* Iterate over plugin devices */
    if( NULL == (*alsa_snd_config) )
    {
        /* alsa_snd_config_update is called implicitly by some functions, if this hasn't happened snd_config will be NULL (bleh) */
        ENSURE_( alsa_snd_config_update(), paUnanticipatedHostError );
        PA_DEBUG(( "Updating snd_config\n" ));
    }
    assert( *alsa_snd_config );
    if( ( res = alsa_snd_config_search( *alsa_snd_config, "pcm", &topNode ) ) >= 0 )
    {
        snd_config_iterator_t i, next;

        alsa_snd_config_for_each( i, next, topNode )
        {
            const char *tpStr = "unknown", *idStr = NULL;
            int err = 0;

            char *alsaDeviceName, *deviceName;
            const HwDevInfo *predefined = NULL;
            snd_config_t *n = alsa_snd_config_iterator_entry( i ), * tp = NULL;;

            if( (err = alsa_snd_config_search( n, "type", &tp )) < 0 )
            {
                if( -ENOENT != err )
                {
                    ENSURE_(err, paUnanticipatedHostError);
                }
            }
            else
            {
                ENSURE_( alsa_snd_config_get_string( tp, &tpStr ), paUnanticipatedHostError );
            }
            ENSURE_( alsa_snd_config_get_id( n, &idStr ), paUnanticipatedHostError );
            if( IgnorePlugin( idStr ) )
            {
                PA_DEBUG(( "%s: Ignoring ALSA plugin device [%s] of type [%s]\n", __FUNCTION__, idStr, tpStr ));
                continue;
            }
            PA_DEBUG(( "%s: Found plugin [%s] of type [%s]\n", __FUNCTION__, idStr, tpStr ));

            PA_UNLESS( alsaDeviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations,
                                                            strlen(idStr) + 6 ), paInsufficientMemory );
            strcpy( alsaDeviceName, idStr );
            PA_UNLESS( deviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations,
                                                            strlen(idStr) + 1 ), paInsufficientMemory );
            strcpy( deviceName, idStr );

            ++numDeviceNames;
            if( !hwDevInfos || numDeviceNames > maxDeviceNames )
            {
                maxDeviceNames *= 2;
                PA_UNLESS( hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) ),
                        paInsufficientMemory );
            }

            predefined = FindDeviceName( alsaDeviceName );

            hwDevInfos[numDeviceNames - 1].alsaName = alsaDeviceName;
            hwDevInfos[numDeviceNames - 1].name     = deviceName;
            hwDevInfos[numDeviceNames - 1].isPlug   = 1;

            if( predefined )
            {
                hwDevInfos[numDeviceNames - 1].hasPlayback = predefined->hasPlayback;
                hwDevInfos[numDeviceNames - 1].hasCapture  = predefined->hasCapture;
            }
            else
            {
                hwDevInfos[numDeviceNames - 1].hasPlayback = 1;
                hwDevInfos[numDeviceNames - 1].hasCapture  = 1;
            }
        }
    }
    else
        PA_DEBUG(( "%s: Iterating over ALSA plugins failed: %s\n", __FUNCTION__, alsa_snd_strerror( res ) ));

    /* allocate deviceInfo memory based on the number of devices */
    PA_UNLESS( baseApi->deviceInfos = (PaDeviceInfo**)PaUtil_GroupAllocateMemory(
            alsaApi->allocations, sizeof(PaDeviceInfo*) * (numDeviceNames) ), paInsufficientMemory );

    /* allocate all device info structs in a contiguous block */
    PA_UNLESS( deviceInfoArray = (PaAlsaDeviceInfo*)PaUtil_GroupAllocateMemory(
            alsaApi->allocations, sizeof(PaAlsaDeviceInfo) * numDeviceNames ), paInsufficientMemory );

    /* Loop over list of cards, filling in info. If a device is deemed unavailable (can't get name),
     * it's ignored.
     *
     * Note that we do this in two stages. This is a workaround owing to the fact that the 'dmix'
     * plugin may cause the underlying hardware device to be busy for a short while even after it
     * (dmix) is closed. The 'default' plugin may also point to the dmix plugin, so the same goes
     * for this.
     */
    PA_DEBUG(( "%s: Filling device info for %d devices\n", __FUNCTION__, numDeviceNames ));
    for( i = 0, devIdx = 0; i < numDeviceNames; ++i )
    {
        PaAlsaDeviceInfo* devInfo = &deviceInfoArray[i];
        HwDevInfo* hwInfo = &hwDevInfos[i];
        if( !strcmp( hwInfo->name, "dmix" ) || !strcmp( hwInfo->name, "default" ) )
        {
            continue;
        }

        PA_ENSURE( FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx ) );
    }
    assert( devIdx < numDeviceNames );
    /* Now inspect 'dmix' and 'default' plugins */
    for( i = 0; i < numDeviceNames; ++i )
    {
        PaAlsaDeviceInfo* devInfo = &deviceInfoArray[i];
        HwDevInfo* hwInfo = &hwDevInfos[i];
        if( strcmp( hwInfo->name, "dmix" ) && strcmp( hwInfo->name, "default" ) )
        {
            continue;
        }

        PA_ENSURE( FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx ) );
    }
    free( hwDevInfos );

    baseApi->info.deviceCount = devIdx;   /* Number of successfully queried devices */

#ifdef PA_ENABLE_DEBUG_OUTPUT
    PA_DEBUG(( "%s: Building device list took %f seconds\n", __FUNCTION__, PaUtil_GetTime() - startTime ));
#endif

end:
    return result;

error:
    /* No particular action */
    goto end;
}